

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.h
# Opt level: O2

int ms5837_read_eeprom(MS5837 *pMS5837)

{
  int iVar1;
  BOOL BVar2;
  long lVar3;
  char *__s;
  
  lVar3 = 0;
  do {
    if (lVar3 + 2 == 0x10) {
      BVar2 = ms5837_crc_check(pMS5837->eeprom_coeff,(byte)(pMS5837->eeprom_coeff[0] >> 0xc));
      if (BVar2 != 0) {
        pMS5837->ms5837_coeff_read = 1;
        return 0;
      }
      __s = "Error reading data from a MS5837 : CRC error. ";
      goto LAB_001852dd;
    }
    iVar1 = ms5837_read_eeprom_coeff
                      (pMS5837,(byte)lVar3 | 0xa0,(uint16_t *)((long)pMS5837->eeprom_coeff + lVar3))
    ;
    lVar3 = lVar3 + 2;
  } while (iVar1 == 0);
  __s = "Error reading data from a MS5837 : ms5837_read_eeprom_coeff failed. ";
LAB_001852dd:
  puts(__s);
  return 1;
}

Assistant:

inline int ms5837_read_eeprom(MS5837* pMS5837)
{
	uint8_t i = 0;

	for (i = 0; i< MS5837_COEFFICIENT_NUMBERS; i++)
	{
		if (ms5837_read_eeprom_coeff(pMS5837, MS5837_PROM_ADDRESS_READ_ADDRESS_0 + i*2, pMS5837->eeprom_coeff+i) != EXIT_SUCCESS)
		{
			printf("Error reading data from a MS5837 : ms5837_read_eeprom_coeff failed. \n");
			return EXIT_FAILURE;
		}
	}

	if (!ms5837_crc_check(pMS5837->eeprom_coeff, (pMS5837->eeprom_coeff[MS5837_CRC_INDEX] & 0xF000)>>12))
	{
		printf("Error reading data from a MS5837 : CRC error. \n");
		return EXIT_FAILURE;
	}

	pMS5837->ms5837_coeff_read = true;

	return EXIT_SUCCESS;
}